

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CodeRhsOfIN(Parse *pParse,Expr *pExpr,int iTab)

{
  byte *pbVar1;
  uint uVar2;
  Vdbe *p;
  Select *pVector;
  ExprList *pEVar3;
  Vdbe *pVVar4;
  SubrtnSig *pSVar5;
  u8 uVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  int addr;
  KeyInfo *zP4;
  uint *zP4_00;
  char *pcVar10;
  CollSeq *pCVar11;
  Select *pSVar12;
  Expr *pEVar13;
  Op *pOVar14;
  ulong uVar15;
  int iVar16;
  ExprList_item *pEVar17;
  uint uVar18;
  int iVar19;
  Op *pOVar20;
  ExprList **ppEVar21;
  long in_FS_OFFSET;
  bool bVar22;
  char affinity;
  SelectDest dest;
  int local_b8;
  char local_69;
  undefined1 local_68 [32];
  undefined8 local_48;
  anon_union_8_18_67db040d_for_u aStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p = pParse->pVdbe;
  if (((pExpr->flags & 0x40) == 0) && (pParse->iSelfTab == 0)) {
    if ((((pExpr->flags >> 0xc & 1) == 0) || ((((pExpr->x).pList)->nAlloc & 2) != 0)) ||
       (zP4_00 = (uint *)sqlite3DbMallocRawNN(pParse->db,0x20), zP4_00 == (uint *)0x0)) {
      zP4_00 = (uint *)0x0;
    }
    else {
      *zP4_00 = ((pExpr->x).pSelect)->selId;
      pcVar10 = exprINAffinity(pParse,pExpr);
      *(char **)(zP4_00 + 2) = pcVar10;
    }
    uVar18 = pExpr->flags;
    if ((uVar18 >> 0x19 & 1) == 0) {
      if ((zP4_00 != (uint *)0x0) && (uVar2 = *zP4_00, (pParse->mSubrtnSig >> (uVar2 & 7) & 1) != 0)
         ) {
        pVVar4 = pParse->pVdbe;
        pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
        pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (pVVar4->db->mallocFailed == '\0') {
          pOVar14 = pVVar4->aOp + 1;
          pOVar20 = pVVar4->aOp + (long)pVVar4->nOp + -1;
        }
        for (; pOVar14 < pOVar20; pOVar14 = pOVar14 + 1) {
          if (((pOVar14->p4type == -0x11) &&
              (pSVar5 = (pOVar14->p4).pSubrtnSig, pSVar5->bComplete != '\0')) &&
             ((uVar2 == pSVar5->selId &&
              (iVar8 = strcmp(*(char **)(zP4_00 + 2),pSVar5->zAff), iVar8 == 0)))) {
            (pExpr->y).sub.iAddr = pSVar5->iAddr;
            (pExpr->y).sub.regReturn = pSVar5->regReturn;
            pExpr->iTable = pSVar5->iTable;
            pExpr->flags = uVar18 | 0x2000000;
            goto LAB_0017eb75;
          }
        }
      }
      pbVar1 = (byte *)((long)&pExpr->flags + 3);
      *pbVar1 = *pbVar1 | 2;
      iVar8 = pParse->nMem + 1;
      pParse->nMem = iVar8;
      (pExpr->y).sub.regReturn = iVar8;
      iVar8 = sqlite3VdbeAddOp3(p,0x4a,0,iVar8,0);
      (pExpr->y).sub.iAddr = iVar8 + 1;
      if (zP4_00 != (uint *)0x0) {
        *(byte *)(zP4_00 + 1) = 0;
        zP4_00[5] = (pExpr->y).sub.iAddr;
        zP4_00[6] = (pExpr->y).sub.regReturn;
        zP4_00[4] = iTab;
        pParse->mSubrtnSig = (u8)(1 << ((byte)*zP4_00 & 7));
        sqlite3VdbeChangeP4(p,-1,(char *)zP4_00,-0x11);
      }
      local_b8 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
      goto LAB_0017e3bf;
    }
LAB_0017eb75:
    iVar8 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
    if ((pExpr->flags & 0x1000) != 0) {
      sqlite3VdbeExplain(pParse,'\0',"REUSE LIST SUBQUERY %d",(ulong)((pExpr->x).pSelect)->selId);
    }
    sqlite3VdbeAddOp3(p,10,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr,0);
    sqlite3VdbeAddOp3(p,0x72,iTab,pExpr->iTable,0);
    if (p->db->mallocFailed == '\0') {
      pOVar14 = p->aOp + iVar8;
    }
    else {
      pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar14->p2 = p->nOp;
    if (zP4_00 != (uint *)0x0) {
      if (*(void **)(zP4_00 + 2) != (void *)0x0) {
        sqlite3DbFreeNN(pParse->db,*(void **)(zP4_00 + 2));
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        sqlite3DbFreeNN(pParse->db,zP4_00);
        return;
      }
      goto LAB_0017ec5f;
    }
  }
  else {
    zP4_00 = (uint *)0x0;
    local_b8 = 0;
LAB_0017e3bf:
    pVector = (Select *)pExpr->pLeft;
    uVar6 = pVector->op;
    if (uVar6 == 0xb0) {
      uVar6 = *(u8 *)&pVector->nSelectRow;
    }
    pSVar12 = pVector;
    if (uVar6 == 0xb1) {
LAB_0017e3ec:
      uVar18 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar12->pEList)->pList->nExpr;
    }
    else {
      uVar18 = 1;
      if (uVar6 == 0x8b) {
        pSVar12 = ((anon_union_8_2_a01b6dbf_for_x *)&pVector->pEList)->pSelect;
        goto LAB_0017e3ec;
      }
    }
    pExpr->iTable = iTab;
    iVar8 = sqlite3VdbeAddOp3(p,0x75,iTab,uVar18,0);
    zP4 = sqlite3KeyInfoAlloc(pParse->db,uVar18,1);
    pSVar12 = (Select *)(pExpr->x).pList;
    if ((pExpr->flags & 0x1000) == 0) {
      if (pSVar12 != (Select *)0x0) {
        local_69 = -0x56;
        local_69 = sqlite3ExprAffinity((Expr *)pVector);
        if (local_69 < 'A') {
          local_69 = 'A';
        }
        else if (local_69 == 'E') {
          local_69 = 'C';
        }
        if (zP4 != (KeyInfo *)0x0) {
          pCVar11 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
          zP4->aColl[0] = pCVar11;
        }
        if (pParse->nTempReg == '\0') {
          iVar16 = pParse->nMem + 1;
          pParse->nMem = iVar16;
        }
        else {
          bVar7 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar7;
          iVar16 = pParse->aTempReg[bVar7];
        }
        if (pParse->nTempReg == '\0') {
          iVar9 = pParse->nMem + 1;
          pParse->nMem = iVar9;
        }
        else {
          bVar7 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar7;
          iVar9 = pParse->aTempReg[bVar7];
        }
        if (0 < *(int *)pSVar12) {
          ppEVar21 = (ExprList **)&pSVar12->iLimit;
          iVar19 = *(int *)pSVar12 + 1;
          do {
            pEVar13 = (Expr *)*ppEVar21;
            if (local_b8 == 0) {
LAB_0017e861:
              local_b8 = 0;
            }
            else {
              aStack_40.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
              local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_48 = (ExprList *)0xaaaa0001aaaaaaaa;
              local_68._8_8_ = exprNodeIsConstant;
              local_68._16_8_ = sqlite3SelectWalkFail;
              local_68._0_8_ = pParse;
              if (pEVar13 != (Expr *)0x0) {
                sqlite3WalkExprNN((Walker *)local_68,pEVar13);
              }
              if (local_48._4_2_ == 0) {
                sqlite3VdbeChangeToNoop(p,local_b8 + -1);
                sqlite3VdbeChangeToNoop(p,local_b8);
                pbVar1 = (byte *)((long)&pExpr->flags + 3);
                *pbVar1 = *pbVar1 & 0xfd;
                goto LAB_0017e861;
              }
            }
            sqlite3ExprCode(pParse,pEVar13,iVar16);
            addr = sqlite3VdbeAddOp3(p,0x61,iVar16,1,iVar9);
            sqlite3VdbeChangeP4(p,addr,&local_69,1);
            sqlite3VdbeAddOp4Int(p,0x8a,iTab,iVar9,iVar16,1);
            ppEVar21 = ppEVar21 + 3;
            iVar19 = iVar19 + -1;
          } while (1 < iVar19);
        }
        if (iVar16 != 0) {
          bVar7 = pParse->nTempReg;
          if ((ulong)bVar7 < 8) {
            pParse->nTempReg = bVar7 + 1;
            pParse->aTempReg[bVar7] = iVar16;
          }
        }
        if (iVar9 != 0) {
          bVar7 = pParse->nTempReg;
          if ((ulong)bVar7 < 8) {
            pParse->nTempReg = bVar7 + 1;
            pParse->aTempReg[bVar7] = iVar9;
          }
        }
      }
    }
    else {
      pEVar3 = pSVar12->pEList;
      sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY %d");
      if (pEVar3->nExpr == uVar18) {
        local_48 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
        local_68._4_4_ = iTab;
        local_68._0_4_ = 0xaaaaaa0b;
        local_68._8_8_ = (_func_int_Walker_ptr_Expr_ptr *)0x0;
        local_68._24_8_ = (_func_void_Walker_ptr_Select_ptr *)0x0;
        local_68._16_8_ = (_func_int_Walker_ptr_Select_ptr *)0xaaaaaaaa00000000;
        local_68._24_8_ = exprINAffinity(pParse,pExpr);
        iVar16 = 0;
        pSVar12->iLimit = 0;
        if ((local_b8 != 0) && ((pParse->db->dbOptFlags & 0x80000) == 0)) {
          iVar9 = pParse->nMem + 1;
          pParse->nMem = iVar9;
          iVar16 = sqlite3VdbeAddOp3(p,0x4d,10000,iVar9,0);
          local_68._8_4_ = iVar9;
        }
        bVar22 = false;
        pSVar12 = sqlite3SelectDup(pParse->db,pSVar12,0);
        if (pParse->db->mallocFailed == '\0') {
          iVar9 = sqlite3Select(pParse,pSVar12,(SelectDest *)local_68);
          bVar22 = iVar9 == 0;
        }
        if (pSVar12 != (Select *)0x0) {
          clearSelect(pParse->db,pSVar12,1);
        }
        if ((_func_void_Walker_ptr_Select_ptr *)local_68._24_8_ !=
            (_func_void_Walker_ptr_Select_ptr *)0x0) {
          sqlite3DbFreeNN(pParse->db,(void *)local_68._24_8_);
        }
        if (iVar16 != 0) {
          uVar6 = p->db->mallocFailed;
          if (uVar6 == '\0') {
            pOVar14 = p->aOp + local_b8;
          }
          else {
            pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar14->p3 = local_68._8_4_;
          if (local_68._8_4_ == 0) {
            sqlite3VdbeChangeToNoop(p,iVar16);
          }
          else {
            if (uVar6 == '\0') {
              pOVar14 = p->aOp + local_b8;
            }
            else {
              pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar14->p3 = local_68._8_4_;
          }
        }
        if (bVar22) {
          if (0 < (int)uVar18) {
            pEVar17 = pEVar3->a;
            uVar15 = 0;
            do {
              pEVar13 = sqlite3VectorFieldSubexpr((Expr *)pVector,(int)uVar15);
              pCVar11 = sqlite3BinaryCompareCollSeq(pParse,pEVar13,pEVar17->pExpr);
              zP4->aColl[uVar15] = pCVar11;
              uVar15 = uVar15 + 1;
              pEVar17 = pEVar17 + 1;
            } while (uVar18 != uVar15);
          }
        }
        else if ((zP4 != (KeyInfo *)0x0) && (zP4->nRef = zP4->nRef - 1, zP4->nRef == 0)) {
          sqlite3DbNNFreeNN(zP4->db,zP4);
        }
        if (!bVar22) goto LAB_0017eb17;
      }
    }
    if (zP4_00 != (uint *)0x0) {
      *(byte *)(zP4_00 + 1) = 1;
    }
    if (zP4 != (KeyInfo *)0x0) {
      sqlite3VdbeChangeP4(p,iVar8,(char *)zP4,-8);
    }
    if (local_b8 != 0) {
      sqlite3VdbeAddOp3(p,0x88,iTab,0,0);
      if (p->db->mallocFailed == '\0') {
        pOVar14 = p->aOp + local_b8;
      }
      else {
        pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar14->p2 = p->nOp;
      sqlite3VdbeAddOp3(p,0x43,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr,1);
      pParse->nTempReg = '\0';
      pParse->nRangeReg = 0;
    }
  }
LAB_0017eb17:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0017ec5f:
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRhsOfIN(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN operator */
  int iTab                /* Use this cursor number */
){
  int addrOnce = 0;           /* Address of the OP_Once instruction at top */
  int addr;                   /* Address of OP_OpenEphemeral instruction */
  Expr *pLeft;                /* the LHS of the IN operator */
  KeyInfo *pKeyInfo = 0;      /* Key information */
  int nVal;                   /* Size of vector pLeft */
  Vdbe *v;                    /* The prepared statement under construction */
  SubrtnSig *pSig = 0;        /* Signature for this subroutine */

  v = pParse->pVdbe;
  assert( v!=0 );

  /* The evaluation of the IN must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can compute the RHS just once
  ** and reuse it many names.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) && pParse->iSelfTab==0 ){
    /* Reuse of the RHS is allowed
    **
    ** Compute a signature for the RHS of the IN operator to facility
    ** finding and reusing prior instances of the same IN operator.
    */
    assert( !ExprUseXSelect(pExpr) || pExpr->x.pSelect!=0 );
    if( ExprUseXSelect(pExpr) && (pExpr->x.pSelect->selFlags & SF_All)==0 ){
      pSig = sqlite3DbMallocRawNN(pParse->db, sizeof(pSig[0]));
      if( pSig ){
        pSig->selId = pExpr->x.pSelect->selId;
        pSig->zAff = exprINAffinity(pParse, pExpr);
      }
    }

    /* Check to see if there is a prior materialization of the RHS of
    ** this IN operator.  If there is, then make use of that prior
    ** materialization rather than recomputing it.
    */
    if( ExprHasProperty(pExpr, EP_Subrtn)
     || findCompatibleInRhsSubrtn(pParse, pExpr, pSig)
    ){
      addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      if( ExprUseXSelect(pExpr) ){
        ExplainQueryPlan((pParse, 0, "REUSE LIST SUBQUERY %d",
              pExpr->x.pSelect->selId));
      }
      assert( ExprUseYSub(pExpr) );
      sqlite3VdbeAddOp2(v, OP_Gosub, pExpr->y.sub.regReturn,
                        pExpr->y.sub.iAddr);
      assert( iTab!=pExpr->iTable );
      sqlite3VdbeAddOp2(v, OP_OpenDup, iTab, pExpr->iTable);
      sqlite3VdbeJumpHere(v, addrOnce);
      if( pSig ){
        sqlite3DbFree(pParse->db, pSig->zAff);
        sqlite3DbFree(pParse->db, pSig);
      }
      return;
    }

    /* Begin coding the subroutine */
    assert( !ExprUseYWin(pExpr) );
    ExprSetProperty(pExpr, EP_Subrtn);
    assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
    pExpr->y.sub.regReturn = ++pParse->nMem;
    pExpr->y.sub.iAddr =
      sqlite3VdbeAddOp2(v, OP_BeginSubrtn, 0, pExpr->y.sub.regReturn) + 1;
    if( pSig ){
      pSig->bComplete = 0;
      pSig->iAddr = pExpr->y.sub.iAddr;
      pSig->regReturn = pExpr->y.sub.regReturn;
      pSig->iTable = iTab;
      pParse->mSubrtnSig = 1 << (pSig->selId&7);
      sqlite3VdbeChangeP4(v, -1, (const char*)pSig, P4_SUBRTNSIG);
    }
    addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  /* Check to see if this is a vector IN operator */
  pLeft = pExpr->pLeft;
  nVal = sqlite3ExprVectorSize(pLeft);

  /* Construct the ephemeral table that will contain the content of
  ** RHS of the IN operator.
  */
  pExpr->iTable = iTab;
  addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pExpr->iTable, nVal);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
  if( ExprUseXSelect(pExpr) ){
    VdbeComment((v, "Result of SELECT %u", pExpr->x.pSelect->selId));
  }else{
    VdbeComment((v, "RHS of IN operator"));
  }
#endif
  pKeyInfo = sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

  if( ExprUseXSelect(pExpr) ){
    /* Case 1:     expr IN (SELECT ...)
    **
    ** Generate code to write the results of the select into the temporary
    ** table allocated and opened above.
    */
    Select *pSelect = pExpr->x.pSelect;
    ExprList *pEList = pSelect->pEList;

    ExplainQueryPlan((pParse, 1, "%sLIST SUBQUERY %d",
        addrOnce?"":"CORRELATED ", pSelect->selId
    ));
    /* If the LHS and RHS of the IN operator do not match, that
    ** error will have been caught long before we reach this point. */
    if( ALWAYS(pEList->nExpr==nVal) ){
      Select *pCopy;
      SelectDest dest;
      int i;
      int rc;
      int addrBloom = 0;
      sqlite3SelectDestInit(&dest, SRT_Set, iTab);
      dest.zAffSdst = exprINAffinity(pParse, pExpr);
      pSelect->iLimit = 0;
      if( addrOnce && OptimizationEnabled(pParse->db, SQLITE_BloomFilter) ){
        int regBloom = ++pParse->nMem;
        addrBloom = sqlite3VdbeAddOp2(v, OP_Blob, 10000, regBloom);
        VdbeComment((v, "Bloom filter"));
        dest.iSDParm2 = regBloom;
      }
      testcase( pSelect->selFlags & SF_Distinct );
      testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
      pCopy = sqlite3SelectDup(pParse->db, pSelect, 0);
      rc = pParse->db->mallocFailed ? 1 :sqlite3Select(pParse, pCopy, &dest);
      sqlite3SelectDelete(pParse->db, pCopy);
      sqlite3DbFree(pParse->db, dest.zAffSdst);
      if( addrBloom ){
        sqlite3VdbeGetOp(v, addrOnce)->p3 = dest.iSDParm2;
        if( dest.iSDParm2==0 ){
          sqlite3VdbeChangeToNoop(v, addrBloom);
        }else{
          sqlite3VdbeGetOp(v, addrOnce)->p3 = dest.iSDParm2;
        }
      }
      if( rc ){
        sqlite3KeyInfoUnref(pKeyInfo);
        return;
      }
      assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
      assert( pEList!=0 );
      assert( pEList->nExpr>0 );
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      for(i=0; i<nVal; i++){
        Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
        pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
            pParse, p, pEList->a[i].pExpr
        );
      }
    }
  }else if( ALWAYS(pExpr->x.pList!=0) ){
    /* Case 2:     expr IN (exprlist)
    **
    ** For each expression, build an index key from the evaluation and
    ** store it in the temporary table. If <expr> is a column, then use
    ** that columns affinity when building index keys. If <expr> is not
    ** a column, use numeric affinity.
    */
    char affinity;            /* Affinity of the LHS of the IN */
    int i;
    ExprList *pList = pExpr->x.pList;
    struct ExprList_item *pItem;
    int r1, r2;
    affinity = sqlite3ExprAffinity(pLeft);
    if( affinity<=SQLITE_AFF_NONE ){
      affinity = SQLITE_AFF_BLOB;
    }else if( affinity==SQLITE_AFF_REAL ){
      affinity = SQLITE_AFF_NUMERIC;
    }
    if( pKeyInfo ){
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    }

    /* Loop through each expression in <exprlist>. */
    r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3GetTempReg(pParse);
    for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
      Expr *pE2 = pItem->pExpr;

      /* If the expression is not constant then we will need to
      ** disable the test that was generated above that makes sure
      ** this code only executes once.  Because for a non-constant
      ** expression we need to rerun this code each time.
      */
      if( addrOnce && !sqlite3ExprIsConstant(pParse, pE2) ){
        sqlite3VdbeChangeToNoop(v, addrOnce-1);
        sqlite3VdbeChangeToNoop(v, addrOnce);
        ExprClearProperty(pExpr, EP_Subrtn);
        addrOnce = 0;
      }

      /* Evaluate the expression and insert it into the temp table */
      sqlite3ExprCode(pParse, pE2, r1);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, r1, 1, r2, &affinity, 1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iTab, r2, r1, 1);
    }
    sqlite3ReleaseTempReg(pParse, r1);
    sqlite3ReleaseTempReg(pParse, r2);
  }
  if( pSig ) pSig->bComplete = 1;
  if( pKeyInfo ){
    sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
  }
  if( addrOnce ){
    sqlite3VdbeAddOp1(v, OP_NullRow, iTab);
    sqlite3VdbeJumpHere(v, addrOnce);
    /* Subroutine return */
    assert( ExprUseYSub(pExpr) );
    assert( sqlite3VdbeGetOp(v,pExpr->y.sub.iAddr-1)->opcode==OP_BeginSubrtn
            || pParse->nErr );
    sqlite3VdbeAddOp3(v, OP_Return, pExpr->y.sub.regReturn,
                      pExpr->y.sub.iAddr, 1);
    VdbeCoverage(v);
    sqlite3ClearTempRegCache(pParse);
  }
}